

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O1

void CityHashCrc256Long(char *s,size_t len,uint32 seed,uint64 *result)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  long *plVar5;
  uint64 old_a_1;
  ulong uVar6;
  uint64 old_a;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64 old_a_3;
  uint64 uVar11;
  ulong uVar12;
  uint64 old_a_4;
  ulong uVar13;
  undefined8 uVar14;
  long lVar15;
  uint64 uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  long lVar20;
  ulong uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  long lVar24;
  
  uVar10 = (ulong)seed;
  uVar7 = *(long *)(s + 0x38) + 0xc3a5c85c97cb3127;
  uVar6 = *(long *)(s + 0x60) + 0xc3a5c85c97cb3127;
  uVar8 = (uVar6 ^ len) * -0x622015f714c7d297;
  uVar8 = (uVar8 >> 0x2f ^ len ^ uVar8) * -0x622015f714c7d297;
  uVar16 = (uVar8 >> 0x2f ^ uVar8) * -0x622015f714c7d297;
  *result = uVar16;
  uVar11 = *(long *)(s + 0x78) * -0x3c5a37a36834ced9 + len;
  result[1] = uVar11;
  uVar13 = *(long *)(s + 0xb8) + uVar10;
  uVar8 = uVar16 + uVar11;
  uVar4 = len / 0xf0;
  lVar1 = uVar4 * 0xf0;
  lVar3 = 0;
  lVar24 = 0;
  lVar15 = 0;
  lVar20 = 0;
  plVar5 = (long *)s;
  uVar12 = uVar11;
  uVar9 = uVar16;
  do {
    uVar6 = (uVar6 >> 0x28 | uVar6 << 0x18) + *plVar5;
    uVar17 = (uVar9 >> 0x1a | uVar9 << 0x26) + plVar5[1];
    uVar12 = (uVar12 >> 0x28 | uVar12 << 0x18) + plVar5[2];
    uVar13 = (uVar13 >> 0x20 | uVar13 << 0x20) + plVar5[3];
    uVar9 = (uVar8 >> 0x18 | uVar8 << 0x28) + plVar5[4];
    uVar22 = crc32(uVar10,uVar6);
    uVar2 = crc32(lVar3,uVar17);
    uVar23 = crc32(lVar24,uVar12);
    uVar14 = crc32(lVar15,uVar13);
    uVar19 = crc32(lVar20,uVar9);
    uVar8 = (uVar17 >> 0x29 | uVar17 * 0x800000) * -0x3c5a37a36834ced9 + plVar5[5];
    uVar12 = (uVar12 >> 0x1b | uVar12 << 0x25) * -0x3c5a37a36834ced9 + plVar5[6];
    uVar13 = (uVar13 >> 0x29 | uVar13 * 0x800000) * -0x3c5a37a36834ced9 + plVar5[7];
    uVar10 = (uVar9 >> 0x21 | uVar9 * 0x80000000) * -0x3c5a37a36834ced9 + plVar5[8];
    uVar17 = (uVar7 >> 0x19 | uVar7 << 0x27) * -0x3c5a37a36834ced9 + plVar5[9];
    uVar22 = crc32(uVar22,uVar8);
    uVar2 = crc32(uVar2,uVar12);
    uVar23 = crc32(uVar23,uVar13);
    uVar14 = crc32(uVar14,uVar10);
    uVar19 = crc32(uVar19,uVar17);
    uVar9 = (uVar12 >> 0x28 | uVar12 * 0x1000000) + plVar5[10];
    uVar12 = (uVar13 >> 0x1a | uVar13 << 0x26) + plVar5[0xb];
    uVar7 = (uVar10 >> 0x28 | uVar10 * 0x1000000) + plVar5[0xc];
    uVar17 = (uVar17 >> 0x20 | uVar17 << 0x20) + plVar5[0xd];
    uVar10 = (uVar6 >> 0x18 | uVar6 << 0x28) + plVar5[0xe];
    uVar22 = crc32(uVar22,uVar9);
    uVar2 = crc32(uVar2,uVar12);
    uVar23 = crc32(uVar23,uVar7);
    uVar14 = crc32(uVar14,uVar17);
    uVar19 = crc32(uVar19,uVar10);
    uVar13 = (uVar12 >> 0x29 | uVar12 * 0x800000) * -0x3c5a37a36834ced9 + plVar5[0xf];
    uVar6 = (uVar7 >> 0x1b | uVar7 << 0x25) * -0x3c5a37a36834ced9 + plVar5[0x10];
    uVar12 = (uVar17 >> 0x29 | uVar17 * 0x800000) * -0x3c5a37a36834ced9 + plVar5[0x11];
    uVar10 = (uVar10 >> 0x21 | uVar10 * 0x80000000) * -0x3c5a37a36834ced9 + plVar5[0x12];
    uVar7 = (uVar8 >> 0x19 | uVar8 << 0x27) * -0x3c5a37a36834ced9 + plVar5[0x13];
    uVar22 = crc32(uVar22,uVar13);
    uVar2 = crc32(uVar2,uVar6);
    uVar23 = crc32(uVar23,uVar12);
    uVar14 = crc32(uVar14,uVar10);
    uVar19 = crc32(uVar19,uVar7);
    uVar8 = (uVar6 >> 0x28 | uVar6 * 0x1000000) + plVar5[0x14];
    uVar6 = (uVar12 >> 0x1a | uVar12 << 0x26) + plVar5[0x15];
    uVar12 = (uVar10 >> 0x28 | uVar10 * 0x1000000) + plVar5[0x16];
    uVar17 = (uVar7 >> 0x20 | uVar7 << 0x20) + plVar5[0x17];
    uVar10 = (uVar9 >> 0x18 | uVar9 << 0x28) + plVar5[0x18];
    uVar22 = crc32(uVar22,uVar8);
    uVar2 = crc32(uVar2,uVar6);
    uVar23 = crc32(uVar23,uVar12);
    uVar14 = crc32(uVar14,uVar17);
    uVar19 = crc32(uVar19,uVar10);
    uVar7 = (uVar6 >> 0x29 | uVar6 * 0x800000) * -0x3c5a37a36834ced9 + plVar5[0x19];
    uVar6 = (uVar12 >> 0x1b | uVar12 << 0x25) * -0x3c5a37a36834ced9 + plVar5[0x1a];
    uVar9 = (uVar17 >> 0x29 | uVar17 * 0x800000) * -0x3c5a37a36834ced9 + plVar5[0x1b];
    uVar12 = (uVar10 >> 0x21 | uVar10 * 0x80000000) * -0x3c5a37a36834ced9 + plVar5[0x1c];
    uVar13 = (uVar13 >> 0x19 | uVar13 << 0x27) * -0x3c5a37a36834ced9 + plVar5[0x1d];
    uVar10 = crc32(uVar22,uVar7);
    lVar3 = crc32(uVar2,uVar6);
    lVar24 = crc32(uVar23,uVar9);
    lVar15 = crc32(uVar14,uVar12);
    lVar20 = crc32(uVar19,uVar13);
    plVar5 = plVar5 + 0x1e;
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
  plVar5 = (long *)(s + lVar1);
  for (uVar4 = len % 0xf0; 0x27 < uVar4; uVar4 = uVar4 - 0x28) {
    uVar17 = (uVar6 >> 0x29 | uVar6 << 0x17) * -0x3c5a37a36834ced9 + *plVar5;
    uVar6 = (uVar9 >> 0x1b | uVar9 << 0x25) * -0x3c5a37a36834ced9 + plVar5[1];
    uVar9 = (uVar12 >> 0x29 | uVar12 << 0x17) * -0x3c5a37a36834ced9 + plVar5[2];
    uVar12 = (uVar13 >> 0x21 | uVar13 << 0x1f) * -0x3c5a37a36834ced9 + plVar5[3];
    uVar13 = (uVar8 >> 0x19 | uVar8 << 0x27) * -0x3c5a37a36834ced9 + plVar5[4];
    uVar10 = crc32(uVar10,uVar17);
    lVar3 = crc32(lVar3,uVar6);
    lVar24 = crc32(lVar24,uVar9);
    lVar15 = crc32(lVar15,uVar12);
    lVar20 = crc32(lVar20,uVar13);
    plVar5 = plVar5 + 5;
    uVar8 = uVar7;
    uVar7 = uVar17;
  }
  uVar17 = uVar7;
  if (uVar4 != 0) {
    uVar17 = (uVar6 >> 0x29 | uVar6 << 0x17) * -0x3c5a37a36834ced9 +
             *(long *)((long)plVar5 + (uVar4 - 0x28));
    uVar6 = (uVar9 >> 0x1b | uVar9 << 0x25) * -0x3c5a37a36834ced9 +
            *(long *)((long)plVar5 + (uVar4 - 0x20));
    uVar9 = (uVar12 >> 0x29 | uVar12 << 0x17) * -0x3c5a37a36834ced9 +
            *(long *)((long)plVar5 + (uVar4 - 0x18));
    uVar12 = (uVar13 >> 0x21 | uVar13 << 0x1f) * -0x3c5a37a36834ced9 +
             *(long *)((long)plVar5 + (uVar4 - 0x10));
    uVar13 = (uVar8 >> 0x19 | uVar8 << 0x27) * -0x3c5a37a36834ced9 +
             *(long *)((long)plVar5 + (uVar4 - 8));
    uVar10 = crc32(uVar10,uVar17);
    lVar3 = crc32(lVar3,uVar6);
    lVar24 = crc32(lVar24,uVar9);
    lVar15 = crc32(lVar15,uVar12);
    lVar20 = crc32(lVar20,uVar13);
    uVar8 = uVar7;
  }
  uVar4 = (lVar15 << 0x20) + lVar20;
  uVar7 = (uVar17 ^ uVar4) * -0x622015f714c7d297;
  uVar17 = (uVar7 >> 0x2f ^ uVar4 ^ uVar7) * -0x622015f714c7d297;
  uVar17 = uVar17 >> 0x2f ^ uVar17;
  uVar7 = (lVar3 << 0x20) + lVar24;
  uVar9 = (uVar9 ^ uVar10) * -0x622015f714c7d297;
  uVar10 = (uVar9 >> 0x2f ^ uVar10 ^ uVar9) * -0x622015f714c7d297;
  uVar10 = (uVar10 >> 0x2f ^ uVar10) * -0x622015f714c7d297 + lVar15;
  uVar9 = (uVar12 ^ uVar16 + uVar13) * -0x622015f714c7d297;
  uVar12 = (uVar9 >> 0x2f ^ uVar16 + uVar13 ^ uVar9) * -0x622015f714c7d297;
  uVar9 = (uVar8 ^ uVar7) * -0x622015f714c7d297;
  uVar8 = (uVar9 >> 0x2f ^ uVar8 ^ uVar9) * -0x622015f714c7d297;
  uVar9 = (uVar10 ^ uVar6 + uVar7) * -0x622015f714c7d297;
  uVar9 = (uVar9 >> 0x2f ^ uVar10 ^ uVar9) * -0x622015f714c7d297;
  uVar21 = uVar17 * -0x622015f714c7d297;
  uVar18 = (uVar12 >> 0x2f ^ uVar12) * -0x622015f714c7d297;
  uVar12 = (uVar8 >> 0x2f ^ uVar8) * -0x622015f714c7d297 + lVar15;
  uVar8 = (uVar21 ^ uVar18) * -0x622015f714c7d297;
  uVar8 = (uVar8 >> 0x2f ^ uVar18 ^ uVar8) * -0x622015f714c7d297;
  lVar24 = (uVar8 >> 0x2f ^ uVar8) * -0x622015f714c7d297 + uVar4 + uVar13;
  uVar8 = (uVar4 + uVar13 ^ uVar12) * -0x622015f714c7d297;
  uVar8 = (uVar8 >> 0x2f ^ uVar12 ^ uVar8) * -0x622015f714c7d297;
  lVar3 = (uVar8 >> 0x2f ^ uVar8) * -0x622015f714c7d297 + uVar10;
  uVar16 = ((uVar9 >> 0x2f ^ uVar9) + uVar17) * -0x622015f714c7d297 + uVar7 + lVar24 + lVar3;
  uVar8 = (lVar3 + uVar21) * -0x3c5a37a36834ced9;
  lVar3 = (uVar8 >> 0x2f ^ uVar8) * -0x3c5a37a36834ced9 + uVar6 + uVar7;
  *result = uVar16;
  uVar11 = uVar11 + uVar16 + lVar3;
  uVar8 = lVar3 * -0x3c5a37a36834ced9;
  lVar3 = (uVar8 >> 0x2f ^ uVar8) * -0x3c5a37a36834ced9 + uVar10;
  result[1] = uVar11;
  uVar11 = uVar11 + lVar3;
  uVar8 = (lVar3 + lVar24) * -0x3c5a37a36834ced9;
  result[2] = uVar11;
  result[3] = (uVar8 >> 0x2f ^ uVar8) * -0x3c5a37a36834ced9 + uVar11;
  return;
}

Assistant:

static void CityHashCrc256Long(const char *s, size_t len,
                               uint32 seed, uint64 *result) {
  uint64 a = Fetch64(s + 56) + k0;
  uint64 b = Fetch64(s + 96) + k0;
  uint64 c = result[0] = HashLen16(b, len);
  uint64 d = result[1] = Fetch64(s + 120) * k0 + len;
  uint64 e = Fetch64(s + 184) + seed;
  uint64 f = seed;
  uint64 g = 0;
  uint64 h = 0;
  uint64 i = 0;
  uint64 j = 0;
  uint64 t = c + d;

  // 240 bytes of input per iter.
  size_t iters = len / 240;
  len -= iters * 240;
  do {
#define CHUNK(multiplier, z)                                    \
    {                                                           \
      uint64 old_a = a;                                         \
      a = Rotate(b, 41 ^ z) * multiplier + Fetch64(s);          \
      b = Rotate(c, 27 ^ z) * multiplier + Fetch64(s + 8);      \
      c = Rotate(d, 41 ^ z) * multiplier + Fetch64(s + 16);     \
      d = Rotate(e, 33 ^ z) * multiplier + Fetch64(s + 24);     \
      e = Rotate(t, 25 ^ z) * multiplier + Fetch64(s + 32);     \
      t = old_a;                                                \
    }                                                           \
    f = _mm_crc32_u64(f, a);                                    \
    g = _mm_crc32_u64(g, b);                                    \
    h = _mm_crc32_u64(h, c);                                    \
    i = _mm_crc32_u64(i, d);                                    \
    j = _mm_crc32_u64(j, e);                                    \
    s += 40

    CHUNK(1, 1); CHUNK(k0, 0);
    CHUNK(1, 1); CHUNK(k0, 0);
    CHUNK(1, 1); CHUNK(k0, 0);
  } while (--iters > 0);

  while (len >= 40) {
    CHUNK(k0, 0);
    len -= 40;
  }
  if (len > 0) {
    s = s + len - 40;
    CHUNK(k0, 0);
  }
  j += i << 32;
  a = HashLen16(a, j);
  h += g << 32;
  b += h;
  c = HashLen16(c, f) + i;
  d = HashLen16(d, e + result[0]);
  j += e;
  i += HashLen16(h, t);
  e = HashLen16(a, d) + j;
  f = HashLen16(b, c) + a;
  g = HashLen16(j, i) + c;
  result[0] = e + f + g + h;
  a = ShiftMix((a + g) * k0) * k0 + b;
  result[1] += a + result[0];
  a = ShiftMix(a * k0) * k0 + c;
  result[2] = a + result[1];
  a = ShiftMix((a + e) * k0) * k0;
  result[3] = a + result[2];
}